

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_udp.c
# Opt level: O1

int nni_plat_udp_multicast_membership(nni_plat_udp *udp,nni_sockaddr *sa,_Bool join)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  int *piVar4;
  undefined4 uVar5;
  uint __optname;
  socklen_t __optlen;
  short local_138 [2];
  undefined4 local_134;
  sockaddr_storage ss;
  sockaddr_storage local;
  socklen_t local_1c [2];
  socklen_t sz;
  
  sVar3 = nni_posix_nn2sockaddr(local_138,sa);
  if ((int)sVar3 == 0) {
    return 0xf;
  }
  if (local_138[0] == 10) {
    local_1c[0] = 0x80;
    iVar1 = getsockname(udp->udp_fd,(sockaddr *)&ss.__ss_align,local_1c);
    if ((-1 < iVar1) && ((short)ss.__ss_align != 10)) {
      return 0xf;
    }
    local.__ss_align._0_2_ = ss.ss_family;
    local.__ss_align._2_1_ = ss.__ss_padding[0];
    local.__ss_align._3_1_ = ss.__ss_padding[1];
    local.__ss_align._4_1_ = ss.__ss_padding[2];
    local.__ss_align._5_1_ = ss.__ss_padding[3];
    local.__ss_align._6_1_ = ss.__ss_padding[4];
    local.__ss_align._7_1_ = ss.__ss_padding[5];
    iVar1 = udp->udp_fd;
    __optname = join ^ 0x15;
    iVar2 = 0x29;
    __optlen = 0x14;
  }
  else {
    if (local_138[0] != 2) {
      return 0xf;
    }
    local_1c[0] = 0x80;
    iVar1 = getsockname(udp->udp_fd,(sockaddr *)&ss.__ss_align,local_1c);
    uVar5 = 0;
    if ((-1 < iVar1) && (uVar5 = ss.__ss_align._4_4_, (short)ss.__ss_align != 2)) {
      return 0xf;
    }
    local.__ss_align = CONCAT44(uVar5,local_134);
    iVar1 = udp->udp_fd;
    __optname = 0x24 - join;
    iVar2 = 0;
    __optlen = 8;
  }
  iVar1 = setsockopt(iVar1,iVar2,__optname,&local.__ss_align,__optlen);
  iVar2 = 0;
  if (iVar1 != 0) {
    piVar4 = __errno_location();
    iVar2 = nni_plat_errno(*piVar4);
  }
  return iVar2;
}

Assistant:

int
nni_plat_udp_multicast_membership(
    nni_plat_udp *udp, nni_sockaddr *sa, bool join)
{
	struct sockaddr_storage ss;
	socklen_t               sz;
	int                     rv;

	sz = nni_posix_nn2sockaddr(&ss, sa);
	if (sz < 1) {
		return (NNG_EADDRINVAL);
	}
	switch (ss.ss_family) {
	case AF_INET:
		rv = ip4_multicast_member(udp, (struct sockaddr *) &ss, join);
		break;
#ifdef NNG_ENABLE_IPV6
	case AF_INET6:
		rv = ip6_multicast_member(udp, (struct sockaddr *) &ss, join);
		break;
#endif
	default:
		rv = NNG_EADDRINVAL;
	}

	return (rv);
}